

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O0

SUNErrCode SUNLogger_SetDebugFilename(SUNLogger logger,char *debug_filename)

{
  int iVar1;
  char *in_RSI;
  SUNLogger in_RDI;
  SUNErrCode local_4;
  
  if (in_RDI == (SUNLogger)0x0) {
    local_4 = -9999;
  }
  else {
    iVar1 = sunLoggerIsOutputRank(in_RDI,(int *)0x0);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      if (in_RSI != (char *)0x0) {
        strcmp(in_RSI,"");
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

SUNErrCode SUNLogger_SetDebugFilename(SUNLogger logger, const char* debug_filename)
{
  if (!logger) { return SUN_ERR_ARG_CORRUPT; }

  if (!sunLoggerIsOutputRank(logger, NULL)) { return SUN_SUCCESS; }

  if (debug_filename && strcmp(debug_filename, ""))
  {
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_DEBUG
    FILE* fp = NULL;
    if (!SUNHashMap_GetValue(logger->filenames, debug_filename, (void*)&fp))
    {
      logger->debug_fp = fp;
    }
    else
    {
      logger->debug_fp = sunOpenLogFile(debug_filename, "w+");
      if (logger->debug_fp)
      {
        SUNHashMap_Insert(logger->filenames, debug_filename,
                          (void*)logger->debug_fp);
      }
      else { return SUN_ERR_FILE_OPEN; }
    }
#endif
  }

  return SUN_SUCCESS;
}